

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Bitmap.cxx
# Opt level: O2

int __thiscall
Fl_Bitmap::start(Fl_Bitmap *this,int XP,int YP,int WP,int HP,int *cx,int *cy,int *X,int *Y,int *W,
                int *H)

{
  int iVar1;
  int iVar2;
  Fl_Bitmask FVar3;
  undefined4 in_register_0000000c;
  int iVar4;
  int iVar5;
  
  if (this->array == (uchar *)0x0) {
    Fl_Image::draw_empty(&this->super_Fl_Image,XP,YP);
    iVar2 = 1;
  }
  else {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2b])
              (fl_graphics_driver,(ulong)(uint)XP,(ulong)(uint)YP,CONCAT44(in_register_0000000c,WP),
               HP,X,Y,W,H);
    *cx = *cx + (*X - XP);
    *cy = *cy + (*Y - YP);
    iVar2 = *cx;
    if (iVar2 < 0) {
      *W = *W + iVar2;
      *X = *X - *cx;
      *cx = 0;
      iVar2 = 0;
    }
    iVar4 = *W;
    iVar5 = (this->super_Fl_Image).w_;
    if (iVar5 < iVar4 + iVar2) {
      iVar4 = iVar5 - iVar2;
      *W = iVar4;
    }
    iVar2 = 1;
    if (0 < iVar4) {
      iVar4 = *cy;
      if (iVar4 < 0) {
        *H = *H + iVar4;
        *Y = *Y - *cy;
        *cy = 0;
        iVar4 = 0;
      }
      iVar5 = *H;
      iVar1 = (this->super_Fl_Image).h_;
      if (iVar1 < iVar5 + iVar4) {
        iVar5 = iVar1 - iVar4;
        *H = iVar5;
      }
      if ((0 < iVar5) && (iVar2 = 0, this->id_ == 0)) {
        FVar3 = fl_create_bitmask((this->super_Fl_Image).w_,(this->super_Fl_Image).h_,this->array);
        this->id_ = (uint)FVar3;
      }
    }
  }
  return iVar2;
}

Assistant:

int Fl_Bitmap::start(int XP, int YP, int WP, int HP, int &cx, int &cy,
		 int &X, int &Y, int &W, int &H)
{
  if (!array) {
    draw_empty(XP, YP);
    return 1;
  }
  // account for current clip region (faster on Irix):
  fl_clip_box(XP,YP,WP,HP,X,Y,W,H);
  cx += X-XP; cy += Y-YP;
  // clip the box down to the size of image, quit if empty:
  if (cx < 0) {W += cx; X -= cx; cx = 0;}
  if (cx+W > w()) W = w()-cx;
  if (W <= 0) return 1;
  if (cy < 0) {H += cy; Y -= cy; cy = 0;}
  if (cy+H > h()) H = h()-cy;
  if (H <= 0) return 1;
#if defined(WIN32)
  if (!id_) id_ = fl_create_bitmap(w(), h(), array);
#else
  if (!id_) id_ = fl_create_bitmask(w(), h(), array);
#endif
  return 0;
}